

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O1

void Sim_CollectNodes_rec(Abc_Obj_t *pRoot,Vec_Ptr_t *vField)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  void **ppvVar5;
  int in_EDX;
  int Fill;
  int Fill_00;
  int iVar6;
  long lVar7;
  
  pAVar3 = pRoot->pNtk;
  iVar6 = pRoot->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar6 + 1,in_EDX);
  if ((-1 < (long)iVar6) && (iVar6 < (pAVar3->vTravIds).nSize)) {
    pAVar4 = pRoot->pNtk;
    if ((pAVar3->vTravIds).pArray[iVar6] == pAVar4->nTravIds) {
      return;
    }
    iVar6 = pRoot->Id;
    Vec_IntFillExtra(&pAVar4->vTravIds,iVar6 + 1,Fill);
    if ((-1 < (long)iVar6) && (iVar6 < (pAVar4->vTravIds).nSize)) {
      pAVar3 = pRoot->pNtk;
      iVar1 = pAVar3->nTravIds;
      if ((pAVar4->vTravIds).pArray[iVar6] != iVar1 + -1) {
        return;
      }
      iVar6 = pRoot->Id;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar6 + 1,Fill_00);
      if (((long)iVar6 < 0) || ((pAVar3->vTravIds).nSize <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar3->vTravIds).pArray[iVar6] = iVar1;
      if (0 < (pRoot->vFanins).nSize) {
        lVar7 = 0;
        do {
          Sim_CollectNodes_rec
                    ((Abc_Obj_t *)pRoot->pNtk->vObjs->pArray[(pRoot->vFanins).pArray[lVar7]],vField)
          ;
          lVar7 = lVar7 + 1;
        } while (lVar7 < (pRoot->vFanins).nSize);
      }
      if ((*(uint *)&pRoot->field_0x14 & 0xf) - 5 < 0xfffffffe) {
        pRoot->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)(long)vField->nSize;
      }
      uVar2 = vField->nCap;
      if (vField->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vField->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vField->pArray,0x80);
          }
          vField->pArray = ppvVar5;
          iVar6 = 0x10;
        }
        else {
          iVar6 = uVar2 * 2;
          if (iVar6 <= (int)uVar2) goto LAB_0029f024;
          if (vField->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vField->pArray,(ulong)uVar2 << 4);
          }
          vField->pArray = ppvVar5;
        }
        vField->nCap = iVar6;
      }
LAB_0029f024:
      iVar6 = vField->nSize;
      vField->nSize = iVar6 + 1;
      vField->pArray[iVar6] = pRoot;
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Sim_CollectNodes_rec( Abc_Obj_t * pRoot, Vec_Ptr_t * vField )
{
    Abc_Obj_t * pFanin;
    int i;
    if ( Abc_NodeIsTravIdCurrent(pRoot) )
        return;
    if ( !Abc_NodeIsTravIdPrevious(pRoot) )
        return;
    Abc_NodeSetTravIdCurrent( pRoot );
    Abc_ObjForEachFanin( pRoot, pFanin, i )
        Sim_CollectNodes_rec( pFanin, vField );
    if ( !Abc_ObjIsCo(pRoot) )
        pRoot->pData = (void *)(ABC_PTRUINT_T)Vec_PtrSize(vField);
    Vec_PtrPush( vField, pRoot );
}